

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O0

char * fl_shortcut_label(uint shortcut,char **eom)

{
  uint uVar1;
  uint uVar2;
  wchar_t wVar3;
  char *local_40;
  char *q;
  uint key;
  char *end;
  char *p;
  char **eom_local;
  char *pcStack_10;
  uint shortcut_local;
  
  end = fl_shortcut_label::buf;
  if (eom != (char **)0x0) {
    *eom = fl_shortcut_label::buf;
  }
  if (shortcut == 0) {
    fl_shortcut_label::buf[0] = '\0';
    pcStack_10 = fl_shortcut_label::buf;
  }
  else {
    uVar1 = shortcut & 0xffff;
    uVar2 = fl_tolower(uVar1);
    eom_local._4_4_ = shortcut;
    if (uVar2 != uVar1) {
      eom_local._4_4_ = shortcut | 0x10000;
    }
    if ((eom_local._4_4_ & 0x40000) != 0) {
      end = add_modifier_key(fl_shortcut_label::buf,fl_shortcut_label::buf + 0x3c,fl_local_ctrl);
    }
    if ((eom_local._4_4_ & 0x80000) != 0) {
      end = add_modifier_key(end,fl_shortcut_label::buf + 0x3c,fl_local_alt);
    }
    if ((eom_local._4_4_ & 0x10000) != 0) {
      end = add_modifier_key(end,fl_shortcut_label::buf + 0x3c,fl_local_shift);
    }
    if ((eom_local._4_4_ & 0x400000) != 0) {
      end = add_modifier_key(end,fl_shortcut_label::buf + 0x3c,fl_local_meta);
    }
    if (eom != (char **)0x0) {
      *eom = end;
    }
    if ((uVar1 == 0xff0d) || (uVar1 == 0xd)) {
      local_40 = "Enter";
    }
    else if ((uVar1 < 0x21) || (0xff < uVar1)) {
      local_40 = (char *)XKeysymToString(uVar1);
    }
    else {
      local_40 = (char *)0x0;
    }
    if (local_40 == (char *)0x0) {
      uVar1 = fl_toupper(uVar1);
      wVar3 = fl_utf8encode(uVar1,end);
      end[wVar3] = '\0';
      pcStack_10 = fl_shortcut_label::buf;
    }
    else if (end < fl_shortcut_label::buf + 1) {
      if (eom != (char **)0x0) {
        *eom = local_40;
      }
      pcStack_10 = local_40;
    }
    else {
      strcpy(end,local_40);
      pcStack_10 = fl_shortcut_label::buf;
    }
  }
  return pcStack_10;
}

Assistant:

const char* fl_shortcut_label(unsigned int shortcut, const char **eom) {
  static char buf[80];
  char *p = buf;
  char *end = &buf[sizeof(buf)-20]; // account for key name (max. ~10 + x)
  if (eom) *eom = p;
  if (!shortcut) {*p = 0; return buf;}
  // fix upper case shortcuts
  unsigned int key = shortcut & FL_KEY_MASK;
  if (((unsigned)fl_tolower(key)) != key) {
    shortcut |= FL_SHIFT;
  }

  // Add modifier key names.
  // Note: if necessary we could change the order here depending on the platform.
  // However, as discussed in fltk.development, the order appears to be the
  // same on all platforms, with exceptions in _some_ Linux applications.

  if (shortcut & FL_CTRL)  {p = add_modifier_key(p, end, fl_local_ctrl);}
  if (shortcut & FL_ALT)   {p = add_modifier_key(p, end, fl_local_alt);}
  if (shortcut & FL_SHIFT) {p = add_modifier_key(p, end, fl_local_shift);}
  if (shortcut & FL_META)  {p = add_modifier_key(p, end, fl_local_meta);}
  if (eom) *eom = p;

  // add key name
#if defined(WIN32) || defined(__APPLE__) // if not X
  if (key >= FL_F && key <= FL_F_Last) {
    *p++ = 'F';
    if (key > FL_F+9) *p++ = (key-FL_F)/10+'0';
    *p++ = (key-FL_F)%10 + '0';
  } else {
    // binary search the table for a match:
    int a = 0;
    int b = sizeof(table)/sizeof(*table);
    while (a < b) {
      int c = (a+b)/2;
      if (table[c].key == key) {
        if (p > buf) {
          strcpy(p,table[c].name); 
          return buf;
        } else {
          const char *sp = table[c].name;
          if (eom) *eom = sp;
          return sp;
        }
      }
      if (table[c].key < key) a = c+1;
      else b = c;
    }
    if (key >= FL_KP && key <= FL_KP_Last) {
      // mark keypad keys with KP_ prefix
      strcpy(p,"KP_"); p += 3;
      *p++ = uchar(key & 127);
    } else {
      // if none found, use the keystroke as a match:
      p += fl_utf8encode(fl_toupper(key), p); 
    }
  }
  *p = 0;
  return buf;
#else
  const char* q;
  if (key == FL_Enter || key == '\r') q="Enter";  // don't use Xlib's "Return":
  else if (key > 32 && key < 0x100) q = 0;
  else q = XKeysymToString(key);
  if (!q) {
    p += fl_utf8encode(fl_toupper(key), p); 
    *p = 0; 
    return buf;
  }
  if (p > buf) {
    strcpy(p,q); 
    return buf;
  } else {
    if (eom) *eom = q;
    return q;
  }
#endif
}